

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O1

int mbedtls_ecjpake_write_shared_key
              (mbedtls_ecjpake_context *ctx,uchar *buf,size_t len,size_t *olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  undefined1 local_70 [8];
  mbedtls_ecp_point K;
  
  K.Z._8_8_ = len;
  mbedtls_ecp_point_init((mbedtls_ecp_point *)local_70);
  iVar1 = mbedtls_ecjpake_derive_k(ctx,(mbedtls_ecp_point *)local_70,f_rng,p_rng);
  if (iVar1 == 0) {
    iVar1 = mbedtls_ecp_point_write_binary
                      (&ctx->grp,(mbedtls_ecp_point *)local_70,ctx->point_format,olen,buf,K.Z._8_8_)
    ;
  }
  mbedtls_ecp_point_free((mbedtls_ecp_point *)local_70);
  return iVar1;
}

Assistant:

int mbedtls_ecjpake_write_shared_key(mbedtls_ecjpake_context *ctx,
                                     unsigned char *buf, size_t len, size_t *olen,
                                     int (*f_rng)(void *, unsigned char *, size_t),
                                     void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_point K;

    mbedtls_ecp_point_init(&K);

    ret = mbedtls_ecjpake_derive_k(ctx, &K, f_rng, p_rng);
    if (ret) {
        goto cleanup;
    }

    ret = mbedtls_ecp_point_write_binary(&ctx->grp, &K, ctx->point_format,
                                         olen, buf, len);
    if (ret != 0) {
        goto cleanup;
    }

cleanup:
    mbedtls_ecp_point_free(&K);

    return ret;
}